

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidgetLayout::~QDockWidgetLayout(QDockWidgetLayout *this)

{
  ~QDockWidgetLayout(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

QDockWidgetLayout::~QDockWidgetLayout()
{
    qDeleteAll(item_list);
}